

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O2

LispPTR N_OP_quot(LispPTR tosm1,LispPTR tos)

{
  uint uVar1;
  LispPTR *pLVar2;
  uint *NAddr;
  LispPTR LVar3;
  LispPTR LVar4;
  
  if ((tosm1 & 0xfff0000) == 0xf0000) {
    LVar4 = tosm1 | 0xffff0000;
  }
  else if ((tosm1 & 0xfff0000) == 0xe0000) {
    LVar4 = tosm1 & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(tosm1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2)
    goto LAB_0010768f;
    pLVar2 = NativeAligned4FromLAddr(tosm1);
    LVar4 = *pLVar2;
  }
  if ((tos & 0xfff0000) == 0xf0000) {
    LVar3 = tos | 0xffff0000;
  }
  else {
    if ((tos & 0xfff0000) == 0xe0000) {
      LVar3 = tos & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(tos >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
LAB_0010768f:
        LVar4 = N_OP_fquotient(tosm1,tos);
        return LVar4;
      }
      pLVar2 = NativeAligned4FromLAddr(tos);
      LVar3 = *pLVar2;
    }
    if (LVar3 == 0) {
      MachineState.tosvalue = tos;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  uVar1 = (uint)((long)(int)LVar4 / (long)(int)LVar3);
  if ((uVar1 & 0xffff0000) == 0xffff0000) {
    LVar4 = uVar1 & 0xffff | 0xf0000;
  }
  else {
    if (((long)(int)LVar4 / (long)(int)LVar3 & 0xffff0000U) != 0) {
      NAddr = (uint *)createcell68k(2);
      *NAddr = uVar1;
      LVar4 = LAddrFromNative(NAddr);
      return LVar4;
    }
    LVar4 = uVar1 | 0xe0000;
  }
  return LVar4;
}

Assistant:

LispPTR N_OP_quot(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_GETNUMBER(tosm1, arg1, doufn);
  N_GETNUMBER(tos, arg2, doufn);
  if (arg2 == 0) goto doufn2;

  result = arg1 / arg2; /* lmm: note: no error case!! */
  N_ARITH_SWITCH(result);

doufn2:
  ERROR_EXIT(tos);
doufn:
  return (N_OP_fquotient(tosm1, tos));

}